

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O3

raw_ostream * __thiscall llvm::raw_ostream::indent(raw_ostream *this,uint NumSpaces)

{
  size_t in_RCX;
  uint uVar1;
  void *__buf_00;
  void *__buf;
  
  __buf = (void *)(ulong)NumSpaces;
  if (NumSpaces < 0x50) {
    write(this,0x164940,__buf,in_RCX);
  }
  else {
    do {
      __buf_00 = (void *)0x4f;
      if ((uint)__buf < 0x4f) {
        __buf_00 = __buf;
      }
      write(this,0x164940,__buf_00,in_RCX);
      uVar1 = (uint)__buf - (int)__buf_00;
      __buf = (void *)(ulong)uVar1;
    } while (uVar1 != 0);
  }
  return this;
}

Assistant:

raw_ostream &raw_ostream::indent(unsigned NumSpaces) {
  return write_padding<' '>(*this, NumSpaces);
}